

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void write_density(bool write_x,bool write_y,bool write_z,string *x_folder,string *y_folder,
                  string *z_folder,bool write_ions,bool scale_j)

{
  bool bVar1;
  ofstream *poVar2;
  ofstream *poVar3;
  ofstream *poVar4;
  long lVar5;
  int iVar6;
  int iVar7;
  int i;
  _Ios_Openmode _Var8;
  ulong uVar9;
  string file_name;
  string file_name_z;
  string file_name_y;
  string file_name_suffix;
  string file_name_x;
  char s_cmr [20];
  ofstream fout_irho;
  
  OutputIterations::get_current_iteration_string_abi_cxx11_(&file_name_suffix,&output_iterations);
  std::operator+(&file_name_y,&data_folder_abi_cxx11_,"/");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fout_irho,
                 &file_name_y,x_folder);
  std::operator+(&file_name_x,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fout_irho,
                 &file_name_suffix);
  std::__cxx11::string::~string((string *)&fout_irho);
  std::__cxx11::string::~string((string *)&file_name_y);
  std::operator+(&file_name_z,&data_folder_abi_cxx11_,"/");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fout_irho,
                 &file_name_z,y_folder);
  std::operator+(&file_name_y,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fout_irho,
                 &file_name_suffix);
  std::__cxx11::string::~string((string *)&fout_irho);
  std::__cxx11::string::~string((string *)&file_name_z);
  std::operator+(&file_name,&data_folder_abi_cxx11_,"/");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fout_irho,
                 &file_name,z_folder);
  std::operator+(&file_name_z,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fout_irho,
                 &file_name_suffix);
  std::__cxx11::string::~string((string *)&fout_irho);
  std::__cxx11::string::~string((string *)&file_name);
  poVar4 = (ofstream *)0x0;
  poVar3 = (ofstream *)0x0;
  poVar2 = (ofstream *)0x0;
  for (uVar9 = 0; (long)uVar9 < (long)n_sr; uVar9 = uVar9 + 1) {
    if (uVar9 == (uint)mpi_rank) {
      if (write_x) {
        poVar2 = (ofstream *)operator_new(0x200);
        std::ofstream::ofstream(poVar2,file_name_x._M_dataplus._M_p,output_mode);
      }
      if (write_y) {
        poVar3 = (ofstream *)operator_new(0x200);
        std::ofstream::ofstream(poVar3,file_name_y._M_dataplus._M_p,output_mode);
      }
      if (write_z) {
        poVar4 = (ofstream *)operator_new(0x200);
        std::ofstream::ofstream(poVar4,file_name_z._M_dataplus._M_p,output_mode);
      }
      iVar6 = nx_sr.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_start[uVar9];
      if (uVar9 != n_sr - 1) {
        iVar6 = iVar6 + nx_ich / -2;
      }
      if (uVar9 == 0) {
        iVar7 = 0;
      }
      else {
        iVar7 = nx_ich / 2;
      }
      if (scale_j) {
        spatial_region::scale_j
                  ((spatial_region *)
                   psr._M_t.
                   super___uniq_ptr_impl<spatial_region,_std::default_delete<spatial_region>_>._M_t.
                   super__Tuple_impl<0UL,_spatial_region_*,_std::default_delete<spatial_region>_>.
                   super__Head_base<0UL,_spatial_region_*,_false>._M_head_impl,dx / dt);
      }
      spatial_region::fout_rho
                ((spatial_region *)
                 psr._M_t.
                 super___uniq_ptr_impl<spatial_region,_std::default_delete<spatial_region>_>._M_t.
                 super__Tuple_impl<0UL,_spatial_region_*,_std::default_delete<spatial_region>_>.
                 super__Head_base<0UL,_spatial_region_*,_false>._M_head_impl,poVar2,poVar3,poVar4,
                 iVar7,iVar6,output_mode);
      if (poVar2 != (ofstream *)0x0) {
        (**(code **)(*(long *)poVar2 + 8))(poVar2);
      }
      if (poVar3 != (ofstream *)0x0) {
        (**(code **)(*(long *)poVar3 + 8))(poVar3);
      }
      if (poVar4 == (ofstream *)0x0) {
        poVar4 = (ofstream *)0x0;
      }
      else {
        (**(code **)(*(long *)poVar4 + 8))(poVar4);
      }
    }
    MPI_Barrier(&ompi_mpi_comm_world);
  }
  iVar6 = get_sr_for_x(xlength - x0fout);
  if (mpi_rank == iVar6) {
    _Var8 = output_mode | _S_app;
    if (write_x) {
      poVar2 = (ofstream *)operator_new(0x200);
      std::ofstream::ofstream(poVar2,file_name_x._M_dataplus._M_p,_Var8);
    }
    else {
      poVar2 = (ofstream *)0x0;
    }
    if (write_y) {
      poVar3 = (ofstream *)operator_new(0x200);
      std::ofstream::ofstream(poVar3,file_name_y._M_dataplus._M_p,_Var8);
    }
    else {
      poVar3 = (ofstream *)0x0;
    }
    if (write_z) {
      poVar4 = (ofstream *)operator_new(0x200);
      std::ofstream::ofstream(poVar4,file_name_z._M_dataplus._M_p,_Var8);
    }
    else {
      poVar4 = (ofstream *)0x0;
    }
    spatial_region::fout_rho_yzplane
              ((spatial_region *)
               psr._M_t.super___uniq_ptr_impl<spatial_region,_std::default_delete<spatial_region>_>.
               _M_t.super__Tuple_impl<0UL,_spatial_region_*,_std::default_delete<spatial_region>_>.
               super__Head_base<0UL,_spatial_region_*,_false>._M_head_impl,poVar2,poVar3,poVar4,
               (int)((xlength - x0fout) / dx) -
               x0_sr.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start[iVar6],_Var8);
    if (poVar2 != (ofstream *)0x0) {
      (**(code **)(*(long *)poVar2 + 8))(poVar2);
    }
    if (poVar3 != (ofstream *)0x0) {
      (**(code **)(*(long *)poVar3 + 8))(poVar3);
    }
    if (poVar4 != (ofstream *)0x0) {
      (**(code **)(*(long *)poVar4 + 8))(poVar4);
    }
  }
  if (write_ions) {
    bVar1 = std::operator==(&ions_abi_cxx11_,"on");
    if (!bVar1) {
      bVar1 = std::operator==(&ions_abi_cxx11_,"positrons");
      if (!bVar1) goto LAB_00113b6b;
    }
    for (lVar5 = 0; lVar5 < n_ion_populations; lVar5 = lVar5 + 1) {
      sprintf(s_cmr,"%g",icmr[lVar5]);
      std::operator+(&file_name,&data_folder_abi_cxx11_,"/irho_");
      std::__cxx11::string::append((char *)&file_name);
      std::__cxx11::string::append((char *)&file_name);
      std::__cxx11::string::append((string *)&file_name);
      for (uVar9 = 0; (long)uVar9 < (long)n_sr; uVar9 = uVar9 + 1) {
        if (uVar9 == (uint)mpi_rank) {
          std::ofstream::ofstream(&fout_irho,file_name._M_dataplus._M_p,output_mode);
          iVar6 = nx_sr.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar9];
          if (uVar9 != n_sr - 1) {
            iVar6 = iVar6 + nx_ich / -2;
          }
          if (uVar9 == 0) {
            iVar7 = 0;
          }
          else {
            iVar7 = nx_ich / 2;
          }
          spatial_region::fout_irho
                    ((spatial_region *)
                     psr._M_t.
                     super___uniq_ptr_impl<spatial_region,_std::default_delete<spatial_region>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_spatial_region_*,_std::default_delete<spatial_region>_>.
                     super__Head_base<0UL,_spatial_region_*,_false>._M_head_impl,(int)lVar5,
                     &fout_irho,iVar7,iVar6,output_mode);
          std::ofstream::close();
          std::ofstream::~ofstream(&fout_irho);
        }
        MPI_Barrier(&ompi_mpi_comm_world);
      }
      iVar6 = get_sr_for_x(xlength - x0fout);
      if (mpi_rank == iVar6) {
        _Var8 = output_mode | _S_app;
        std::ofstream::ofstream(&fout_irho,file_name._M_dataplus._M_p,_Var8);
        spatial_region::fout_irho_yzplane
                  ((spatial_region *)
                   psr._M_t.
                   super___uniq_ptr_impl<spatial_region,_std::default_delete<spatial_region>_>._M_t.
                   super__Tuple_impl<0UL,_spatial_region_*,_std::default_delete<spatial_region>_>.
                   super__Head_base<0UL,_spatial_region_*,_false>._M_head_impl,(int)lVar5,&fout_irho
                   ,(int)((xlength - x0fout) / dx) -
                    x0_sr.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[iVar6],_Var8);
        std::ofstream::close();
        std::ofstream::~ofstream(&fout_irho);
      }
      std::__cxx11::string::~string((string *)&file_name);
    }
  }
LAB_00113b6b:
  std::__cxx11::string::~string((string *)&file_name_z);
  std::__cxx11::string::~string((string *)&file_name_y);
  std::__cxx11::string::~string((string *)&file_name_x);
  std::__cxx11::string::~string((string *)&file_name_suffix);
  return;
}

Assistant:

void write_density(bool write_x, bool write_y, bool write_z,
        std::string x_folder, std::string y_folder, std::string z_folder,
        bool write_ions = false, bool scale_j = false)
{
    std::string file_name_suffix = output_iterations.get_current_iteration_string();
    ofstream* pof_x = 0;
    ofstream* pof_y = 0;
    ofstream* pof_z = 0;

    string file_name_x = data_folder + "/" + x_folder + file_name_suffix;
    string file_name_y = data_folder + "/" + y_folder + file_name_suffix;
    string file_name_z = data_folder + "/" + z_folder + file_name_suffix;

    int onx;
    int onx0;
    for(int i=0;i<n_sr;i++)
    {
        if (mpi_rank == i) {
            if (write_x) {
                pof_x = new ofstream(file_name_x.c_str(), output_mode);
            }

            if (write_y) {
                pof_y = new ofstream(file_name_y.c_str(), output_mode);
            }
            if (write_z) {
                pof_z = new ofstream(file_name_z.c_str(), output_mode);
            }

            if(i==n_sr-1)
                onx = nx_sr[i];
            else
                onx = nx_sr[i]-nx_ich/2;
            if(i==0)
                onx0 = 0;
            else
                onx0 = nx_ich/2;
            if (scale_j) {
                psr->scale_j(dx / dt);
            }
            psr->fout_rho(pof_x,pof_y,pof_z,onx0,onx, output_mode);

            if (pof_x) delete pof_x;
            if (pof_y) delete pof_y;
            if (pof_z) delete pof_z;
        }
        MPI_Barrier(MPI_COMM_WORLD);
    }

    pof_x = 0;
    pof_y = 0;
    pof_z = 0;
    
    int ii = get_sr_for_x(xlength-x0fout);
    if (mpi_rank == ii) {
        ios_base::openmode mode = output_mode | ios_base::app;
        if (write_x) {
            pof_x = new ofstream(file_name_x.c_str(), mode);
        }
        if (write_y) {
            pof_y = new ofstream(file_name_y.c_str(), mode);
        }
        if (write_z) {
            pof_z = new ofstream(file_name_z.c_str(), mode);
        }
        psr->fout_rho_yzplane(pof_x,pof_y,pof_z,get_xindex_in_sr(xlength-x0fout, ii), mode);
        if (pof_x) delete pof_x;
        if (pof_y) delete pof_y;
        if (pof_z) delete pof_z;
    }

    if (write_ions && (ions=="on" || ions=="positrons"))
    {
        char s_cmr[20];
        for (int n=0;n<n_ion_populations;n++)
        {
            sprintf(s_cmr,"%g",icmr[n]);
            string file_name = data_folder+"/irho_";
            file_name += s_cmr;
            file_name += "_";
            file_name += file_name_suffix;
            for(int i=0;i<n_sr;i++)
            {
                if (mpi_rank == i) {
                    ofstream fout_irho(file_name.c_str(), output_mode);
                    if(i==n_sr-1)
                        onx = nx_sr[i];
                    else
                        onx = nx_sr[i]-nx_ich/2;
                    if(i==0)
                        onx0 = 0;
                    else
                        onx0 = nx_ich/2;
                    psr->fout_irho(n,&fout_irho,onx0,onx, output_mode);
                    fout_irho.close();
                }
                MPI_Barrier(MPI_COMM_WORLD);
            }
            ii = get_sr_for_x(xlength-x0fout);
            if (mpi_rank == ii) {
                ios_base::openmode mode = output_mode | ios_base::app;
                ofstream fout_irho(file_name.c_str(), mode);
                psr->fout_irho_yzplane(n,&fout_irho,get_xindex_in_sr(xlength-x0fout, ii), mode);
                fout_irho.close();
            }
        }
    }
}